

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_cfg.cpp
# Opt level: O2

bool __thiscall mocker::RemoveUnreachableBlocks::operator()(RemoveUnreachableBlocks *this)

{
  FunctionModule *pFVar1;
  size_t sVar2;
  iterator iVar3;
  BasicBlock *bb;
  _List_node_base *p_Var4;
  __off64_t *in_R8;
  size_t in_R9;
  _List_node_base *p_Var5;
  unsigned_long *succ;
  _List_node_base *p_Var6;
  uint in_stack_ffffffffffffff48;
  _List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> local_b0;
  _List_node_base *local_98;
  _List_node_base *local_90;
  function<void_(unsigned_long)> visit;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  reachable;
  
  reachable._M_h._M_buckets = &reachable._M_h._M_single_bucket;
  reachable._M_h._M_bucket_count = 1;
  reachable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reachable._M_h._M_element_count = 0;
  reachable._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reachable._M_h._M_rehash_policy._M_next_resize = 0;
  reachable._M_h._M_single_bucket = (__node_base_ptr)0x0;
  visit.super__Function_base._M_manager = (_Manager_type)0x0;
  visit._M_invoker = (_Invoker_type)0x0;
  visit.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  visit.super__Function_base._M_functor._8_8_ = 0;
  visit.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(function<void_(unsigned_long)> **)visit.super__Function_base._M_functor._M_unused._0_8_ = &visit
  ;
  *(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    **)((long)visit.super__Function_base._M_functor._M_unused._0_8_ + 8) = &reachable;
  *(RemoveUnreachableBlocks **)((long)visit.super__Function_base._M_functor._M_unused._0_8_ + 0x10)
       = this;
  visit._M_invoker =
       std::
       _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/simplify_cfg.cpp:116:48)>
       ::_M_invoke;
  visit.super__Function_base._M_manager =
       std::
       _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/simplify_cfg.cpp:116:48)>
       ::_M_manager;
  std::function<void_(unsigned_long)>::operator()
            (&visit,(unsigned_long)
                    (((this->super_FuncPass).func)->bbs).
                    super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                    ._M_impl._M_node.super__List_node_base._M_next[1]._M_next);
  p_Var4 = (_List_node_base *)&((this->super_FuncPass).func)->bbs;
  local_98 = p_Var4;
  while( true ) {
    p_Var4 = (((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == local_98) break;
    local_b0._M_impl._M_node.super__List_node_base._M_next = p_Var4[1]._M_next;
    iVar3 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&reachable._M_h,(key_type *)&local_b0);
    if (iVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
      ir::BasicBlock::getSuccessors
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0,
                 (BasicBlock *)(p_Var4 + 1));
      p_Var5 = local_b0._M_impl._M_node.super__List_node_base._M_prev;
      for (p_Var6 = local_b0._M_impl._M_node.super__List_node_base._M_next; p_Var6 != p_Var5;
          p_Var6 = (_List_node_base *)&p_Var6->_M_prev) {
        bb = ir::FunctionModule::getMutableBasicBlock
                       ((this->super_FuncPass).func,(size_t)p_Var6->_M_next);
        deletePhiOptionInBB(bb,((BasicBlock *)(p_Var4 + 1))->labelID);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0);
    }
  }
  pFVar1 = (this->super_FuncPass).func;
  this->cnt = (pFVar1->bbs).
              super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
              _M_impl._M_node._M_size - reachable._M_h._M_element_count;
  local_b0._M_impl._M_node._M_size = 0;
  p_Var4 = (pFVar1->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  local_b0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b0;
  local_b0._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b0;
  while (p_Var5 = p_Var4, p_Var5 != (_List_node_base *)&pFVar1->bbs) {
    p_Var4 = p_Var5->_M_next;
    local_90 = p_Var5[1]._M_next;
    iVar3 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&reachable._M_h,(key_type *)&local_90);
    if (iVar3.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0) {
      std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::splice
                ((list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)&local_b0,
                 (int)local_b0._M_impl._M_node.super__List_node_base._M_next,
                 (__off64_t *)&pFVar1->bbs,(int)p_Var5,in_R8,in_R9,in_stack_ffffffffffffff48);
    }
  }
  std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_clear(&local_b0);
  sVar2 = this->cnt;
  std::_Function_base::~_Function_base(&visit.super__Function_base);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&reachable._M_h);
  return sVar2 != 0;
}

Assistant:

bool RemoveUnreachableBlocks::operator()() {
  std::unordered_set<std::size_t> reachable;
  std::function<void(std::size_t cur)> visit = [&visit, &reachable,
                                                this](std::size_t cur) {
    if (reachable.find(cur) != reachable.end())
      return;
    reachable.emplace(cur);
    for (auto suc : func.getBasicBlock(cur).getSuccessors())
      visit(suc);
  };
  visit(func.getFirstBB()->getLabelID());

  for (auto &bb : func.getBBs()) {
    if (reachable.find(bb.getLabelID()) != reachable.end())
      continue;
    for (auto &succ : bb.getSuccessors()) {
      deletePhiOptionInBB(func.getMutableBasicBlock(succ), bb.getLabelID());
    }
  }

  cnt = func.getBBs().size() - reachable.size();
  func.getMutableBBs().remove_if([&reachable](const ir::BasicBlock &bb) {
    return reachable.find(bb.getLabelID()) == reachable.end();
  });
  return cnt != 0;
}